

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::assertLessThan
               (size_t n,size_t s)

{
  ostream *poVar1;
  undefined8 *puVar2;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  if (n < s) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Size max value. Upper bound: ",0x1d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," found ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),asStack_1b8);
  *puVar2 = 0x1cc910;
  puVar2[1] = 0x1cc940;
  __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void assertLessThan(size_t n, size_t s) {
        if (n >= s) {
            std::ostringstream oss;
            oss << "Size max value. Upper bound: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }